

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

maybe<unsigned_int,_void> *
pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::hex_value
          (maybe<unsigned_int,_void> *__return_storage_ptr__,char32_t c,uint value)

{
  uint uVar1;
  
  uVar1 = c + L'\xffffffd0';
  if (9 < uVar1) {
    if ((uint)(c + L'\xffffff9f') < 6) {
      uVar1 = c + L'\xffffffa9';
    }
    else {
      if (5 < (uint)(c + L'\xffffffbf')) {
        __return_storage_ptr__->valid_ = false;
        *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
        __return_storage_ptr__->storage_ = (type)0x0;
        return __return_storage_ptr__;
      }
      uVar1 = c + L'\xffffffc9';
    }
  }
  __return_storage_ptr__->valid_ = true;
  __return_storage_ptr__->storage_ = (type)(value * 0x10 + uVar1);
  return __return_storage_ptr__;
}

Assistant:

maybe<unsigned> string_matcher<Callbacks>::hex_value (char32_t const c,
                                                                  unsigned const value) {
                auto digit = 0U;
                if (c >= '0' && c <= '9') {
                    digit = static_cast<unsigned> (c) - '0';
                } else if (c >= 'a' && c <= 'f') {
                    digit = static_cast<unsigned> (c) - 'a' + 10;
                } else if (c >= 'A' && c <= 'F') {
                    digit = static_cast<unsigned> (c) - 'A' + 10;
                } else {
                    return nothing<unsigned> ();
                }
                return just (16 * value + digit);
            }